

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ResourceMappingBase.cpp
# Opt level: O2

void __thiscall
Diligent::ResourceMappingImpl::AddResourceArray
          (ResourceMappingImpl *this,Char *Name,Uint32 StartIndex,IDeviceObject **ppObjects,
          Uint32 NumElements,bool bIsUnique)

{
  undefined4 in_register_00000084;
  char (*Args_2) [80];
  undefined3 in_register_00000089;
  ulong uVar1;
  pair<std::__detail::_Node_iterator<std::pair<const_Diligent::ResourceMappingImpl::ResMappingHashKey,_Diligent::RefCntAutoPtr<Diligent::IDeviceObject>_>,_false,_false>,_bool>
  pVar2;
  IDeviceObject *pObject;
  undefined4 local_74;
  SpinLock *local_70;
  Char *Name_local;
  ulong local_60;
  IDeviceObject **local_58;
  string msg;
  
  local_74 = CONCAT31(in_register_00000089,bIsUnique);
  Args_2 = (char (*) [80])CONCAT44(in_register_00000084,NumElements);
  if ((Name != (Char *)0x0) && (*Name != '\0')) {
    local_70 = &this->m_Lock;
    Name_local = Name;
    local_58 = ppObjects;
    Threading::SpinLock::lock(local_70);
    local_60 = (ulong)StartIndex;
    for (uVar1 = 0; NumElements != uVar1; uVar1 = uVar1 + 1) {
      pObject = local_58[uVar1];
      ResMappingHashKey::ResMappingHashKey
                ((ResMappingHashKey *)&msg,Name_local,true,(int)local_60 + (int)uVar1);
      pVar2 = std::
              _Hashtable<Diligent::ResourceMappingImpl::ResMappingHashKey,std::pair<Diligent::ResourceMappingImpl::ResMappingHashKey_const,Diligent::RefCntAutoPtr<Diligent::IDeviceObject>>,Diligent::STDAllocator<std::pair<Diligent::ResourceMappingImpl::ResMappingHashKey_const,Diligent::RefCntAutoPtr<Diligent::IDeviceObject>>,Diligent::IMemoryAllocator>,std::__detail::_Select1st,std::equal_to<Diligent::ResourceMappingImpl::ResMappingHashKey>,Diligent::HashMapStringKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              ::
              _M_emplace<Diligent::ResourceMappingImpl::ResMappingHashKey,Diligent::IDeviceObject*&>
                        ((_Hashtable<Diligent::ResourceMappingImpl::ResMappingHashKey,std::pair<Diligent::ResourceMappingImpl::ResMappingHashKey_const,Diligent::RefCntAutoPtr<Diligent::IDeviceObject>>,Diligent::STDAllocator<std::pair<Diligent::ResourceMappingImpl::ResMappingHashKey_const,Diligent::RefCntAutoPtr<Diligent::IDeviceObject>>,Diligent::IMemoryAllocator>,std::__detail::_Select1st,std::equal_to<Diligent::ResourceMappingImpl::ResMappingHashKey>,Diligent::HashMapStringKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                          *)&this->m_HashTable,&msg,&pObject);
      HashMapStringKey::Clear((HashMapStringKey *)&msg);
      if ((((undefined1  [16])pVar2 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
         (*(IDeviceObject **)
           ((long)pVar2.first.
                  super__Node_iterator_base<std::pair<const_Diligent::ResourceMappingImpl::ResMappingHashKey,_Diligent::RefCntAutoPtr<Diligent::IDeviceObject>_>,_false>
                  ._M_cur.
                  super__Node_iterator_base<std::pair<const_Diligent::ResourceMappingImpl::ResMappingHashKey,_Diligent::RefCntAutoPtr<Diligent::IDeviceObject>_>,_false>
           + 0x20) != pObject)) {
        if ((char)local_74 != '\0') {
          FormatString<char[43]>(&msg,(char (*) [43])"Resource with the same name already exists");
          DebugAssertionFailed
                    (msg._M_dataplus._M_p,"AddResourceArray",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/ResourceMappingBase.cpp"
                     ,0x37);
          std::__cxx11::string::~string((string *)&msg);
          FormatString<char[20],char_const*,char[80]>
                    (&msg,(Diligent *)"Resource with name ",(char (*) [20])&Name_local,
                     (char **)
                     " marked is unique, but already present in the hash.\nNew resource will be used\n."
                     ,Args_2);
          if (DebugMessageCallback != (undefined *)0x0) {
            Args_2 = (char (*) [80])0x0;
            (*(code *)DebugMessageCallback)(1,msg._M_dataplus._M_p,0,0);
          }
          std::__cxx11::string::~string((string *)&msg);
        }
        RefCntAutoPtr<Diligent::IDeviceObject>::operator=
                  ((RefCntAutoPtr<Diligent::IDeviceObject> *)
                   ((long)pVar2.first.
                          super__Node_iterator_base<std::pair<const_Diligent::ResourceMappingImpl::ResMappingHashKey,_Diligent::RefCntAutoPtr<Diligent::IDeviceObject>_>,_false>
                          ._M_cur.
                          super__Node_iterator_base<std::pair<const_Diligent::ResourceMappingImpl::ResMappingHashKey,_Diligent::RefCntAutoPtr<Diligent::IDeviceObject>_>,_false>
                   + 0x20),pObject);
      }
    }
    Threading::SpinLock::unlock(local_70);
  }
  return;
}

Assistant:

void ResourceMappingImpl::AddResourceArray(const Char* Name, Uint32 StartIndex, IDeviceObject* const* ppObjects, Uint32 NumElements, bool bIsUnique)
{
    if (Name == nullptr || *Name == 0)
        return;

    Threading::SpinLockGuard Guard{m_Lock};
    for (Uint32 Elem = 0; Elem < NumElements; ++Elem)
    {
        auto* pObject = ppObjects[Elem];

        // Try to construct new element in place
        auto Elems = m_HashTable.emplace(ResMappingHashKey{Name, true /*Make copy*/, StartIndex + Elem}, pObject);
        // If there is already element with the same name, replace it
        if (!Elems.second && Elems.first->second != pObject)
        {
            if (bIsUnique)
            {
                UNEXPECTED("Resource with the same name already exists");
                LOG_WARNING_MESSAGE(
                    "Resource with name ", Name,
                    " marked is unique, but already present in the hash.\n"
                    "New resource will be used\n.");
            }
            Elems.first->second = pObject;
        }
    }
}